

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

Module * remote::GetModuleHandle(Module *__return_storage_ptr__,Handle proc,string *filename)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pRVar4;
  ostream *poVar5;
  size_t sVar6;
  string local_130;
  vector<remote::Region,_std::allocator<remote::Region>_> local_110;
  undefined1 local_f1;
  undefined1 local_f0 [8];
  Region reg;
  iterator __end1;
  iterator __begin1;
  vector<remote::Region,_std::allocator<remote::Region>_> *__range1;
  vector<remote::Region,_std::allocator<remote::Region>_> regs;
  undefined1 local_38 [8];
  vector<remote::Region,_std::allocator<remote::Region>_> processRegions;
  string *filename_local;
  Module *pMStack_10;
  Handle proc_local;
  Module *ret;
  
  processRegions.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  filename_local._4_4_ = proc.pid;
  pMStack_10 = __return_storage_ptr__;
  Handle::GetRegions((vector<remote::Region,_std::allocator<remote::Region>_> *)local_38,
                     (Handle *)((long)&filename_local + 4));
  sVar3 = std::vector<remote::Region,_std::allocator<remote::Region>_>::size
                    ((vector<remote::Region,_std::allocator<remote::Region>_> *)local_38);
  if (sVar3 == 0) {
    Module::Module(__return_storage_ptr__);
    regs.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<remote::Region,_std::allocator<remote::Region>_>::vector
              ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range1);
    __end1 = std::vector<remote::Region,_std::allocator<remote::Region>_>::begin
                       ((vector<remote::Region,_std::allocator<remote::Region>_> *)local_38);
    reg.filename.field_2._8_8_ =
         std::vector<remote::Region,_std::allocator<remote::Region>_>::end
                   ((vector<remote::Region,_std::allocator<remote::Region>_> *)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
                                       *)((long)&reg.filename.field_2 + 8)), bVar1) {
      pRVar4 = __gnu_cxx::
               __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
               ::operator*(&__end1);
      Region::Region((Region *)local_f0,pRVar4);
      iVar2 = std::__cxx11::string::compare((string *)(reg.pathname.field_2._M_local_buf + 8));
      if (iVar2 == 0) {
        std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back
                  ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range1,
                   (value_type *)local_f0);
      }
      Region::~Region((Region *)local_f0);
      __gnu_cxx::
      __normal_iterator<remote::Region_*,_std::vector<remote::Region,_std::allocator<remote::Region>_>_>
      ::operator++(&__end1);
    }
    local_f1 = 0;
    std::vector<remote::Region,_std::allocator<remote::Region>_>::vector
              (&local_110,(vector<remote::Region,_std::allocator<remote::Region>_> *)&__range1);
    Module::Module(__return_storage_ptr__,&local_110);
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_110);
    bVar1 = Module::IsValid(__return_storage_ptr__);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Regions: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
      sVar6 = Module::GetRegionCount(__return_storage_ptr__);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"Path: ");
      Module::GetPath_abi_cxx11_(&local_130,__return_storage_ptr__);
      poVar5 = std::operator<<(poVar5,(string *)&local_130);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_130);
      Module::CacheSymbolData(__return_storage_ptr__);
    }
    regs.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    local_f1 = 1;
    std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector
              ((vector<remote::Region,_std::allocator<remote::Region>_> *)&__range1);
  }
  std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector
            ((vector<remote::Region,_std::allocator<remote::Region>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Module remote::GetModuleHandle(Handle proc, string filename) {
    vector<Region> processRegions = proc.GetRegions();

    if(processRegions.size() == 0) {
        return Module();
    }

    vector<Region> regs;

    for(auto reg : processRegions) {
        if(reg.filename.compare(filename) == 0) {
            regs.push_back(reg);
        }
    }

    Module ret = Module(regs);

    if(ret.IsValid()) {
        std::cout << "Regions: " << std::hex << ret.GetRegionCount() << std::endl;
        std::cout << "Path: " << ret.GetPath() << std::endl;

        ret.CacheSymbolData();
    }

    return ret;
}